

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O0

char * Lexer::TokenName(Token t)

{
  char *pcStack_10;
  Token t_local;
  
  switch(t) {
  case ERROR:
    pcStack_10 = "lexing error";
    break;
  case BUILD:
    pcStack_10 = "\'build\'";
    break;
  case COLON:
    pcStack_10 = "\':\'";
    break;
  case DEFAULT:
    pcStack_10 = "\'default\'";
    break;
  case EQUALS:
    pcStack_10 = "\'=\'";
    break;
  case IDENT:
    pcStack_10 = "identifier";
    break;
  case INCLUDE:
    pcStack_10 = "\'include\'";
    break;
  case INDENT:
    pcStack_10 = "indent";
    break;
  case NEWLINE:
    pcStack_10 = "newline";
    break;
  case PIPE:
    pcStack_10 = "\'|\'";
    break;
  case PIPE2:
    pcStack_10 = "\'||\'";
    break;
  case POOL:
    pcStack_10 = "\'pool\'";
    break;
  case RULE:
    pcStack_10 = "\'rule\'";
    break;
  case SUBNINJA:
    pcStack_10 = "\'subninja\'";
    break;
  case TEOF:
    pcStack_10 = "eof";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char* Lexer::TokenName(Token t) {
  switch (t) {
  case ERROR:    return "lexing error";
  case BUILD:    return "'build'";
  case COLON:    return "':'";
  case DEFAULT:  return "'default'";
  case EQUALS:   return "'='";
  case IDENT:    return "identifier";
  case INCLUDE:  return "'include'";
  case INDENT:   return "indent";
  case NEWLINE:  return "newline";
  case PIPE2:    return "'||'";
  case PIPE:     return "'|'";
  case POOL:     return "'pool'";
  case RULE:     return "'rule'";
  case SUBNINJA: return "'subninja'";
  case TEOF:     return "eof";
  }
  return NULL;  // not reached
}